

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone_info_source.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::time_internal::cctz::ZoneInfoSource::Version_abi_cxx11_
          (string *__return_storage_ptr__,ZoneInfoSource *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string ZoneInfoSource::Version() const { return std::string(); }